

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

bool node::anon_unknown_2::FillBlock
               (CBlockIndex *index,FoundBlock *block,
               UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *lock,CChain *active,
               BlockManager *blockman)

{
  int iVar1;
  uint256 *puVar2;
  uint256 *puVar3;
  pointer ppCVar4;
  CBlockLocator *pCVar5;
  pointer puVar6;
  pointer puVar7;
  CBlock *pCVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  base_blob<256U> *pbVar12;
  bool bVar13;
  int64_t iVar14;
  CBlockIndex *pCVar15;
  long in_FS_OFFSET;
  reverse_lock revlock26;
  undefined1 local_98 [16];
  pointer local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (index == (CBlockIndex *)0x0) goto LAB_00963f3e;
  puVar2 = block->m_hash;
  if (puVar2 != (uint256 *)0x0) {
    puVar3 = index->phashBlock;
    if (puVar3 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    uVar9 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
    uVar10 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
    uVar11 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar11;
    *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems = uVar9;
    *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8) = uVar10;
  }
  if (block->m_height != (int *)0x0) {
    *block->m_height = index->nHeight;
  }
  if ((ulong *)block->m_time != (ulong *)0x0) {
    *block->m_time = (ulong)index->nTime;
  }
  if ((ulong *)block->m_max_time != (ulong *)0x0) {
    *block->m_max_time = (ulong)index->nTimeMax;
  }
  if (block->m_mtp_time != (int64_t *)0x0) {
    iVar14 = CBlockIndex::GetMedianTimePast(index);
    *block->m_mtp_time = iVar14;
  }
  if (block->m_in_active_chain != (bool *)0x0) {
    iVar1 = index->nHeight;
    if (((long)iVar1 < 0) ||
       (ppCVar4 = (active->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       (int)((ulong)((long)(active->vChain).
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)ppCVar4) >> 3) <= iVar1)) {
      pCVar15 = (CBlockIndex *)0x0;
    }
    else {
      pCVar15 = ppCVar4[iVar1];
    }
    *block->m_in_active_chain = pCVar15 == index;
  }
  if (block->m_locator != (CBlockLocator *)0x0) {
    GetLocator((CBlockLocator *)local_98,index);
    pCVar5 = block->m_locator;
    puVar6 = (pCVar5->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (pCVar5->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (pCVar5->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
    (pCVar5->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
    (pCVar5->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_88;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (mutex_type *)0x0;
    local_88 = (pointer)0x0;
    if (puVar6 != (pointer)0x0) {
      operator_delete(puVar6,(long)puVar7 - (long)puVar6);
      if ((pointer)local_98._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
      }
    }
  }
  if (block->m_next_block != (FoundBlock *)0x0) {
    iVar1 = index->nHeight;
    if (((long)iVar1 < 0) ||
       (ppCVar4 = (active->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       (int)((ulong)((long)(active->vChain).
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)ppCVar4) >> 3) <= iVar1)) {
      pCVar15 = (CBlockIndex *)0x0;
    }
    else {
      pCVar15 = ppCVar4[iVar1];
    }
    if ((pCVar15 == index) && (-2 < iVar1)) {
      ppCVar4 = (active->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(active->vChain).
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4) >> 3) <=
          (int)(iVar1 + 1U)) goto LAB_00963eb4;
      pCVar15 = ppCVar4[iVar1 + 1U];
    }
    else {
LAB_00963eb4:
      pCVar15 = (CBlockIndex *)0x0;
    }
    FillBlock(pCVar15,block->m_next_block,lock,active,blockman);
  }
  if (block->m_data != (CBlock *)0x0) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::reverse_lock::reverse_lock
              ((reverse_lock *)local_98,lock,"lock",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
               ,0x1b7);
    bVar13 = BlockManager::ReadBlockFromDisk(blockman,block->m_data,index);
    if (!bVar13) {
      pCVar8 = block->m_data;
      *(undefined8 *)
       ((pCVar8->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) =
           0;
      (pCVar8->super_CBlockHeader).nBits = 0;
      (pCVar8->super_CBlockHeader).nNonce = 0;
      pbVar12 = &(pCVar8->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
      (pbVar12->m_data)._M_elems[0xc] = '\0';
      (pbVar12->m_data)._M_elems[0xd] = '\0';
      (pbVar12->m_data)._M_elems[0xe] = '\0';
      (pbVar12->m_data)._M_elems[0xf] = '\0';
      (pbVar12->m_data)._M_elems[0x10] = '\0';
      (pbVar12->m_data)._M_elems[0x11] = '\0';
      (pbVar12->m_data)._M_elems[0x12] = '\0';
      (pbVar12->m_data)._M_elems[0x13] = '\0';
      pbVar12 = &(pCVar8->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
      (pbVar12->m_data)._M_elems[0x14] = '\0';
      (pbVar12->m_data)._M_elems[0x15] = '\0';
      (pbVar12->m_data)._M_elems[0x16] = '\0';
      (pbVar12->m_data)._M_elems[0x17] = '\0';
      (pbVar12->m_data)._M_elems[0x18] = '\0';
      (pbVar12->m_data)._M_elems[0x19] = '\0';
      (pbVar12->m_data)._M_elems[0x1a] = '\0';
      (pbVar12->m_data)._M_elems[0x1b] = '\0';
      *(undefined8 *)
       ((pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0
      ;
      pbVar12 = &(pCVar8->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
      (pbVar12->m_data)._M_elems[4] = '\0';
      (pbVar12->m_data)._M_elems[5] = '\0';
      (pbVar12->m_data)._M_elems[6] = '\0';
      (pbVar12->m_data)._M_elems[7] = '\0';
      (pbVar12->m_data)._M_elems[8] = '\0';
      (pbVar12->m_data)._M_elems[9] = '\0';
      (pbVar12->m_data)._M_elems[10] = '\0';
      (pbVar12->m_data)._M_elems[0xb] = '\0';
      pbVar12 = &(pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
      (pbVar12->m_data)._M_elems[0xc] = '\0';
      (pbVar12->m_data)._M_elems[0xd] = '\0';
      (pbVar12->m_data)._M_elems[0xe] = '\0';
      (pbVar12->m_data)._M_elems[0xf] = '\0';
      (pbVar12->m_data)._M_elems[0x10] = '\0';
      (pbVar12->m_data)._M_elems[0x11] = '\0';
      (pbVar12->m_data)._M_elems[0x12] = '\0';
      (pbVar12->m_data)._M_elems[0x13] = '\0';
      pbVar12 = &(pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
      (pbVar12->m_data)._M_elems[0x14] = '\0';
      (pbVar12->m_data)._M_elems[0x15] = '\0';
      (pbVar12->m_data)._M_elems[0x16] = '\0';
      (pbVar12->m_data)._M_elems[0x17] = '\0';
      (pbVar12->m_data)._M_elems[0x18] = '\0';
      (pbVar12->m_data)._M_elems[0x19] = '\0';
      (pbVar12->m_data)._M_elems[0x1a] = '\0';
      (pbVar12->m_data)._M_elems[0x1b] = '\0';
      (pCVar8->super_CBlockHeader).nVersion = 0;
      (pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      (pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      (pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      (pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      pbVar12 = &(pCVar8->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
      (pbVar12->m_data)._M_elems[4] = '\0';
      (pbVar12->m_data)._M_elems[5] = '\0';
      (pbVar12->m_data)._M_elems[6] = '\0';
      (pbVar12->m_data)._M_elems[7] = '\0';
      (pbVar12->m_data)._M_elems[8] = '\0';
      (pbVar12->m_data)._M_elems[9] = '\0';
      (pbVar12->m_data)._M_elems[10] = '\0';
      (pbVar12->m_data)._M_elems[0xb] = '\0';
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::clear(&pCVar8->vtx);
      pCVar8->fChecked = false;
      pCVar8->m_checked_witness_commitment = false;
      pCVar8->m_checked_merkle_root = false;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::reverse_lock::~reverse_lock
              ((reverse_lock *)local_98);
  }
  block->found = true;
LAB_00963f3e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return index != (CBlockIndex *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool FillBlock(const CBlockIndex* index, const FoundBlock& block, UniqueLock<RecursiveMutex>& lock, const CChain& active, const BlockManager& blockman)
{
    if (!index) return false;
    if (block.m_hash) *block.m_hash = index->GetBlockHash();
    if (block.m_height) *block.m_height = index->nHeight;
    if (block.m_time) *block.m_time = index->GetBlockTime();
    if (block.m_max_time) *block.m_max_time = index->GetBlockTimeMax();
    if (block.m_mtp_time) *block.m_mtp_time = index->GetMedianTimePast();
    if (block.m_in_active_chain) *block.m_in_active_chain = active[index->nHeight] == index;
    if (block.m_locator) { *block.m_locator = GetLocator(index); }
    if (block.m_next_block) FillBlock(active[index->nHeight] == index ? active[index->nHeight + 1] : nullptr, *block.m_next_block, lock, active, blockman);
    if (block.m_data) {
        REVERSE_LOCK(lock);
        if (!blockman.ReadBlockFromDisk(*block.m_data, *index)) block.m_data->SetNull();
    }
    block.found = true;
    return true;
}